

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

bool __thiscall
gl4cts::GPUShaderFP64Test1::verifyErrorGenerationWhenCallingDoubleUniformFunctionsWithInvalidCount
          (GPUShaderFP64Test1 *this)

{
  GPUShaderFP64Test1 *this_00;
  uint uVar1;
  GLint uniform_location;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  char *__s;
  size_t sVar5;
  TestError *this_01;
  long lVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  GPUShaderFP64Test1 *this_02;
  long lVar9;
  GLint uniforms [29];
  GLdouble double_values [16];
  GLint local_2c8 [32];
  long local_248;
  ulong local_240;
  undefined8 local_238 [17];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  puVar7 = &DAT_01a7f130;
  puVar8 = local_238;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar8 = *puVar7;
    puVar7 = puVar7 + 1;
    puVar8 = puVar8 + 1;
  }
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  local_2c8[0] = this->m_po_bool_uniform_location;
  local_2c8[1] = this->m_po_bvec2_uniform_location;
  local_2c8[2] = this->m_po_bvec3_uniform_location;
  local_2c8[3] = this->m_po_bvec4_uniform_location;
  local_2c8[4] = this->m_po_dmat2_uniform_location;
  local_2c8[5] = this->m_po_dmat2x3_uniform_location;
  local_2c8[6] = this->m_po_dmat2x4_uniform_location;
  local_2c8[7] = this->m_po_dmat3_uniform_location;
  local_2c8[8] = this->m_po_dmat3x2_uniform_location;
  local_2c8[9] = this->m_po_dmat3x4_uniform_location;
  local_2c8[10] = this->m_po_dmat4_uniform_location;
  local_2c8[0xb] = this->m_po_dmat4x2_uniform_location;
  local_2c8[0xc] = this->m_po_dmat4x3_uniform_location;
  local_2c8[0xd] = this->m_po_double_uniform_location;
  local_2c8[0xe] = this->m_po_dvec2_uniform_location;
  local_2c8[0xf] = this->m_po_dvec3_uniform_location;
  local_2c8[0x10] = this->m_po_dvec4_uniform_location;
  local_2c8[0x11] = this->m_po_float_uniform_location;
  local_2c8[0x12] = this->m_po_int_uniform_location;
  local_2c8[0x13] = this->m_po_ivec2_uniform_location;
  local_2c8[0x14] = this->m_po_ivec3_uniform_location;
  local_2c8[0x15] = this->m_po_ivec4_uniform_location;
  local_2c8[0x16] = this->m_po_uint_uniform_location;
  local_2c8[0x17] = this->m_po_uvec2_uniform_location;
  local_2c8[0x18] = this->m_po_uvec3_uniform_location;
  local_2c8[0x19] = this->m_po_uvec4_uniform_location;
  local_2c8[0x1a] = this->m_po_vec2_uniform_location;
  local_2c8[0x1b] = this->m_po_vec3_uniform_location;
  local_2c8[0x1c] = this->m_po_vec4_uniform_location;
  this_00 = (GPUShaderFP64Test1 *)(local_1b0 + 8);
  bVar2 = true;
  local_248 = 0;
  do {
    uVar1 = (&DAT_01a7f0f0)[local_248];
    local_240 = (ulong)uVar1;
    lVar9 = 0;
    do {
      uniform_location = local_2c8[lVar9];
      bVar3 = isMatrixUniform(this,uniform_location);
      if (bVar3) {
        if (uVar1 - 8 < 9) {
code_r0x0092c59c:
          switch(uVar1) {
          case 1:
            (**(code **)(lVar6 + 0x14d8))(uniform_location,2,local_238);
            break;
          default:
            this_01 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_01,"Unrecognized uniform function",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                       ,0x9f0);
            __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          case 3:
            (**(code **)(lVar6 + 0x1518))(uniform_location,2,local_238);
            break;
          case 5:
            (**(code **)(lVar6 + 0x1558))(uniform_location,2,local_238);
            break;
          case 7:
            (**(code **)(lVar6 + 0x1598))(uniform_location,2,local_238);
            break;
          case 8:
            (**(code **)(lVar6 + 0x15d8))(uniform_location,2,0,local_238);
            break;
          case 9:
            (**(code **)(lVar6 + 0x15e8))(uniform_location,2,0,local_238);
            break;
          case 10:
            (**(code **)(lVar6 + 0x15f8))(uniform_location,2,0,local_238);
            break;
          case 0xb:
            (**(code **)(lVar6 + 0x1608))(uniform_location,2,0,local_238);
            break;
          case 0xc:
            (**(code **)(lVar6 + 0x1618))(uniform_location,2,0,local_238);
            break;
          case 0xd:
            (**(code **)(lVar6 + 0x1628))(uniform_location,2,0,local_238);
            break;
          case 0xe:
            (**(code **)(lVar6 + 0x1638))(uniform_location,2,0,local_238);
            break;
          case 0xf:
            (**(code **)(lVar6 + 0x1648))(uniform_location,2,0,local_238);
            break;
          case 0x10:
            (**(code **)(lVar6 + 0x1658))(uniform_location,2,0,local_238);
          }
          iVar4 = (**(code **)(lVar6 + 0x800))();
          if (iVar4 != 0x502) {
            local_1b0._0_8_ =
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
            this_02 = this_00;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Function ",9);
            __s = getUniformFunctionString(this_02,(_uniform_function)local_240);
            sVar5 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar5);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,
                       "() was called with an invalid count argument but did not generate a GL_INVALID_OPERATION error"
                       ,0x5e);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
            std::ios_base::~ios_base(local_138);
            bVar2 = false;
          }
        }
      }
      else if (8 < uVar1 - 8) goto code_r0x0092c59c;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x1d);
    local_248 = local_248 + 1;
    if (local_248 == 0xd) {
      return bVar2;
    }
  } while( true );
}

Assistant:

bool GPUShaderFP64Test1::verifyErrorGenerationWhenCallingDoubleUniformFunctionsWithInvalidCount()
{
	const glw::GLdouble double_values[16] = { 1.0, 2.0,  3.0,  4.0,  5.0,  6.0,  7.0,  8.0,
											  9.0, 10.0, 11.0, 12.0, 13.0, 14.0, 15.0, 16.0 };
	const glw::Functions&   gl					= m_context.getRenderContext().getFunctions();
	bool					result				= true;
	const _uniform_function uniform_functions[] = { UNIFORM_FUNCTION_1DV,		  UNIFORM_FUNCTION_2DV,
													UNIFORM_FUNCTION_3DV,		  UNIFORM_FUNCTION_4DV,
													UNIFORM_FUNCTION_MATRIX2DV,   UNIFORM_FUNCTION_MATRIX2X3DV,
													UNIFORM_FUNCTION_MATRIX2X4DV, UNIFORM_FUNCTION_MATRIX3DV,
													UNIFORM_FUNCTION_MATRIX3X2DV, UNIFORM_FUNCTION_MATRIX3X4DV,
													UNIFORM_FUNCTION_MATRIX4DV,   UNIFORM_FUNCTION_MATRIX4X2DV,
													UNIFORM_FUNCTION_MATRIX4X3DV };
	const glw::GLint uniforms[] = {
		m_po_bool_uniform_location,	m_po_bvec2_uniform_location,  m_po_bvec3_uniform_location,
		m_po_bvec4_uniform_location,   m_po_dmat2_uniform_location,  m_po_dmat2x3_uniform_location,
		m_po_dmat2x4_uniform_location, m_po_dmat3_uniform_location,  m_po_dmat3x2_uniform_location,
		m_po_dmat3x4_uniform_location, m_po_dmat4_uniform_location,  m_po_dmat4x2_uniform_location,
		m_po_dmat4x3_uniform_location, m_po_double_uniform_location, m_po_dvec2_uniform_location,
		m_po_dvec3_uniform_location,   m_po_dvec4_uniform_location,  m_po_float_uniform_location,
		m_po_int_uniform_location,	 m_po_ivec2_uniform_location,  m_po_ivec3_uniform_location,
		m_po_ivec4_uniform_location,   m_po_uint_uniform_location,   m_po_uvec2_uniform_location,
		m_po_uvec3_uniform_location,   m_po_uvec4_uniform_location,  m_po_vec2_uniform_location,
		m_po_vec3_uniform_location,	m_po_vec4_uniform_location
	};

	const unsigned int n_uniform_functions = sizeof(uniform_functions) / sizeof(uniform_functions[0]);
	const unsigned int n_uniforms		   = sizeof(uniforms) / sizeof(uniforms[0]);

	for (unsigned int n_uniform_function = 0; n_uniform_function < n_uniform_functions; ++n_uniform_function)
	{
		_uniform_function uniform_function = uniform_functions[n_uniform_function];

		for (unsigned int n_uniform = 0; n_uniform < n_uniforms; ++n_uniform)
		{
			glw::GLint uniform_location = uniforms[n_uniform];

			/* Make sure we only use glUniformMatrix*() functions with matrix uniforms,
			 * and glUniform*() functions with vector uniforms.
			 */
			bool is_matrix_uniform = isMatrixUniform(uniform_location);

			if (((false == is_matrix_uniform) && (true == isMatrixUniformFunction(uniform_function))) ||
				((true == is_matrix_uniform) && (false == isMatrixUniformFunction(uniform_function))))
			{
				continue;
			}

			/* Issue the call with an invalid <count> argument */
			switch (uniform_function)
			{
			case UNIFORM_FUNCTION_1DV:
				gl.uniform1dv(uniform_location, 2, double_values);
				break;
			case UNIFORM_FUNCTION_2DV:
				gl.uniform2dv(uniform_location, 2, double_values);
				break;
			case UNIFORM_FUNCTION_3DV:
				gl.uniform3dv(uniform_location, 2, double_values);
				break;
			case UNIFORM_FUNCTION_4DV:
				gl.uniform4dv(uniform_location, 2, double_values);
				break;
			case UNIFORM_FUNCTION_MATRIX2DV:
				gl.uniformMatrix2dv(uniform_location, 2, GL_FALSE, double_values);
				break;
			case UNIFORM_FUNCTION_MATRIX2X3DV:
				gl.uniformMatrix2x3dv(uniform_location, 2, GL_FALSE, double_values);
				break;
			case UNIFORM_FUNCTION_MATRIX2X4DV:
				gl.uniformMatrix2x4dv(uniform_location, 2, GL_FALSE, double_values);
				break;
			case UNIFORM_FUNCTION_MATRIX3DV:
				gl.uniformMatrix3dv(uniform_location, 2, GL_FALSE, double_values);
				break;
			case UNIFORM_FUNCTION_MATRIX3X2DV:
				gl.uniformMatrix3x2dv(uniform_location, 2, GL_FALSE, double_values);
				break;
			case UNIFORM_FUNCTION_MATRIX3X4DV:
				gl.uniformMatrix3x4dv(uniform_location, 2, GL_FALSE, double_values);
				break;
			case UNIFORM_FUNCTION_MATRIX4DV:
				gl.uniformMatrix4dv(uniform_location, 2, GL_FALSE, double_values);
				break;
			case UNIFORM_FUNCTION_MATRIX4X2DV:
				gl.uniformMatrix4x2dv(uniform_location, 2, GL_FALSE, double_values);
				break;
			case UNIFORM_FUNCTION_MATRIX4X3DV:
				gl.uniformMatrix4x3dv(uniform_location, 2, GL_FALSE, double_values);
				break;

			default:
			{
				TCU_FAIL("Unrecognized uniform function");
			}
			} /* switch (uniform_function) */

			/* Make sure GL_INVALID_VALUE was generated */
			glw::GLenum error_code = gl.getError();

			if (error_code != GL_INVALID_OPERATION)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Function " << getUniformFunctionString(uniform_function)
								   << "() "
									  "was called with an invalid count argument but did not generate a "
									  "GL_INVALID_OPERATION error"
								   << tcu::TestLog::EndMessage;

				result = false;
			}
		} /* for (all non-arrayed uniforms) */
	}	 /* for (all uniform functions) */

	return result;
}